

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  deInt32 *pdVar6;
  SharedPtr xfbTarget;
  SharedPtr variable;
  SharedPtr variable_1;
  SharedPtr local_98;
  SharedPtr local_88;
  SharedPtr local_78;
  Node *local_68;
  SharedPtrStateBase *local_60;
  TestNode *local_58;
  Context *local_50;
  ProgramResourceQueryTestTarget local_48;
  Node *local_40;
  SharedPtrStateBase *local_38;
  
  local_58 = &targetGroup->super_TestNode;
  local_50 = context;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar3 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar1->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160330;
  local_40 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_38 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160368;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
  local_68 = pNVar3;
  local_60 = (SharedPtrStateBase *)operator_new(0x20);
  local_60->strongRefCount = 0;
  local_60->weakRefCount = 0;
  local_60->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  local_60[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  local_60->strongRefCount = 1;
  local_60->weakRefCount = 1;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_40;
  (pNVar3->m_enclosingNode).m_state = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_38->strongRefCount = local_38->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160e30;
  pNVar3[1]._vptr_Node = (_func_int **)0x19eeb36;
  local_98.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_98.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING
             ,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar5,local_50,&local_98,(ProgramResourceQueryTestTarget *)&local_88,
             "builtin_gl_position");
  tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
  pSVar2 = local_98.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_98.m_ptr = (Node *)0x0;
    (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_68;
  (pNVar3->m_enclosingNode).m_state = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_60->strongRefCount = local_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160e30;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160410;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 4;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar1;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_88.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING
             ,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar5,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_78,
             "default_block_basic_type");
  tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
  pSVar2 = local_88.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_88.m_ptr = (Node *)0x0;
    (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_98.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_STRUCT_MEMBER;
  (pNVar3->m_enclosingNode).m_ptr = local_68;
  (pNVar3->m_enclosingNode).m_state = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_60->strongRefCount = local_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160498;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160e30;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_48,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar5,local_50,&local_78,&local_48,"default_block_struct_member");
  tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
  pSVar2 = local_78.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_98.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = local_68;
  (pNVar3->m_enclosingNode).m_state = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_60->strongRefCount = local_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160e30;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021603d8;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_48,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase(pRVar5,local_50,&local_78,&local_48,"default_block_array");
  tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
  pSVar2 = local_78.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_98.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = local_68;
  (pNVar3->m_enclosingNode).m_state = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_60->strongRefCount = local_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021603d8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_02160e30;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_02160410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_48,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar5,local_50,&local_78,&local_48,"default_block_array_element");
  tcu::TestNode::addChild(local_58,(TestNode *)pRVar5);
  pSVar2 = local_78.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_88.m_state;
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_88.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_98.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_60->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_68 = (Node *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])(local_60);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_60 != (SharedPtrStateBase *)0x0)) {
      (*local_60->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_38->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_40 = (Node *)0x0;
      (*local_38->_vptr_SharedPtrStateBase[2])(local_38);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_38 != (SharedPtrStateBase *)0x0)) {
      (*local_38->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateTransformFeedbackVariableBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new ResourceTestCase(context, xfbTarget, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array_element"));
	}
}